

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O3

void __thiscall
vkt::wsi::anon_unknown_0::TriangleRenderer::TriangleRenderer
          (TriangleRenderer *this,DeviceInterface *vkd,VkDevice device,Allocator *allocator,
          BinaryCollection *binaryRegistry,
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          *swapchainImages,VkFormat framebufferFormat,UVec2 *renderSize)

{
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  *this_00;
  deUint64 dVar1;
  deUint64 dVar2;
  pointer pSVar3;
  long *plVar4;
  pointer pSVar5;
  Allocation *pAVar6;
  undefined8 *puVar7;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *pvVar8;
  VkResult VVar9;
  const_iterator cVar10;
  deUint64 *pdVar11;
  long *plVar12;
  int *piVar13;
  long lVar14;
  ulong uVar15;
  pointer pHVar16;
  VkMappedMemoryRange memRange;
  VkSubpassDependency dependencies [2];
  VkAttachmentReference colorAttRef;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkVertexInputBindingDescription vertexBinding0;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D scissor0;
  VkPipelineColorBlendAttachmentState attBlendParams0;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  undefined8 local_3c8;
  VkSubpassDescription *pVStack_3c0;
  undefined8 local_3b8;
  VkPipelineInputAssemblyStateCreateInfo *pVStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  Unique<vk::Handle<(vk::HandleType)17>_> *local_378;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *local_370;
  undefined1 local_368 [16];
  VkDevice local_358;
  VkImage VStack_350;
  undefined8 local_348;
  VkPipelineInputAssemblyStateCreateInfo *pVStack_340;
  VkPipelineTessellationStateCreateInfo *local_338;
  VkPipelineVertexInputStateCreateInfo *pVStack_330;
  VkPipelineRasterizationStateCreateInfo *local_328;
  VkPipelineMultisampleStateCreateInfo *local_320;
  VkPipelineDepthStencilStateCreateInfo *local_318;
  VkPipelineColorBlendStateCreateInfo *local_310;
  VkPipelineDynamicStateCreateInfo *local_308;
  VkPipelineLayout local_300;
  VkRenderPass local_2f8;
  deUint32 local_2f0;
  VkPipeline local_2e8;
  deInt32 local_2e0;
  Unique<vk::Handle<(vk::HandleType)8>_> *local_2d8;
  Unique<vk::Handle<(vk::HandleType)18>_> *local_2d0;
  Unique<vk::Handle<(vk::HandleType)16>_> *local_2c8;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *local_2c0;
  undefined1 local_2b8 [24];
  PFN_vkFreeFunction p_Stack_2a0;
  PFN_vkInternalAllocationNotification local_298;
  PFN_vkInternalFreeNotification p_Stack_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  deUint64 local_270;
  char *local_268;
  PFN_vkInternalFreeNotification local_260;
  VkShaderModule local_258;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_250;
  VkShaderModule local_238;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_230;
  VkPipelineVertexInputStateCreateInfo local_210;
  undefined1 local_1e0 [16];
  VkDevice local_1d0;
  VkAllocationCallbacks *pVStack_1c8;
  VkPipelineColorBlendAttachmentState *local_1c0;
  float local_1b8 [4];
  void *local_1a8;
  PFN_vkAllocationFunction p_Stack_1a0;
  PFN_vkReallocationFunction p_Stack_198;
  PFN_vkFreeFunction p_Stack_190;
  PFN_vkInternalAllocationNotification local_188;
  PFN_vkInternalFreeNotification p_Stack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  Move<vk::Handle<(vk::HandleType)18>_> local_168;
  VkVertexInputBindingDescription local_148;
  VkVertexInputAttributeDescription local_138;
  VkVertexInputAttributeDescription local_120;
  VkViewport local_110;
  VkPipelineColorBlendAttachmentState local_f8;
  VkPipelineInputAssemblyStateCreateInfo local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  VkPipelineMultisampleStateCreateInfo local_98;
  VkPipelineVertexInputStateCreateInfo local_60;
  
  this->m_vkd = vkd;
  local_370 = swapchainImages;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&this->m_swapchainImages,swapchainImages);
  (this->m_renderSize).m_data[0] = renderSize->m_data[0];
  (this->m_renderSize).m_data[1] = renderSize->m_data[1];
  local_1a8 = (void *)((ulong)framebufferFormat << 0x20);
  p_Stack_1a0 = (PFN_vkAllocationFunction)0x100000001;
  p_Stack_198 = (PFN_vkReallocationFunction)0x200000000;
  p_Stack_190 = (PFN_vkFreeFunction)&DAT_00000001;
  local_188 = (PFN_vkInternalAllocationNotification)CONCAT44(local_188._4_4_,0x3b9acdea);
  local_348 = &local_210;
  local_210.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_210._4_4_ = 2;
  pVStack_3c0 = (VkSubpassDescription *)local_368;
  local_358 = (VkDevice)0x0;
  pVStack_340 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  local_328 = (VkPipelineRasterizationStateCreateInfo *)0x0;
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)0x0;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  VStack_350.m_internal = (deUint64)&DAT_00000001;
  local_288 = 0x100008000;
  local_298 = (PFN_vkInternalAllocationNotification)0x400ffffffff;
  p_Stack_290 = (PFN_vkInternalFreeNotification)0x18000002000;
  local_2b8._16_8_ = (PFN_vkReallocationFunction)0x18000008000;
  p_Stack_2a0 = (PFN_vkFreeFunction)&DAT_00000001;
  local_2b8._0_8_ = (void *)0xffffffff;
  local_2b8._8_8_ = (PFN_vkAllocationFunction)0x40000002000;
  local_3e8._0_4_ = 0x26;
  local_3e8._8_8_ = (DeviceInterface *)0x0;
  local_3d8._M_allocated_capacity = 0x100000000;
  local_3c8._0_4_ = 1;
  local_3b8._0_4_ = 2;
  local_3d8._8_8_ = (VkPipelineRasterizationStateCreateInfo *)&local_1a8;
  pVStack_3b0 = (VkPipelineInputAssemblyStateCreateInfo *)local_2b8;
  local_2c0 = &this->m_swapchainImages;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)local_1e0,vkd,device,
             (VkRenderPassCreateInfo *)local_3e8,(VkAllocationCallbacks *)0x0);
  local_378 = &this->m_renderPass;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       local_1d0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       pVStack_1c8;
  (local_378->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
       CONCAT44(local_1e0._4_4_,local_1e0._0_4_);
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_1e0._8_8_;
  local_2b8._8_4_ = 4;
  local_2b8._0_8_ = &DAT_00000001;
  local_368._4_4_ = local_1e0._4_4_;
  local_368._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_348._4_4_,1);
  pVStack_340 = (VkPipelineInputAssemblyStateCreateInfo *)local_2b8;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)local_3e8,vkd,device,
             (VkPipelineLayoutCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
  local_2c8 = &this->m_pipelineLayout;
  local_358 = (VkDevice)local_3d8._M_allocated_capacity;
  VStack_350.m_internal = local_3d8._8_8_;
  local_368._0_8_ = local_3e8._0_8_;
  local_368._8_8_ = local_3e8._8_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)local_3d8._M_allocated_capacity;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)local_3d8._8_8_;
  (local_2c8->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       local_3e8._0_8_;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)local_3e8._8_8_;
  dVar1 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
          m_internal;
  dVar2 = (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.
          m_internal;
  local_3d8._M_allocated_capacity = 0x747265762d697274;
  local_3e8._8_8_ = (DeviceInterface *)0x8;
  local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = &local_3d8;
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)binaryRegistry,(key_type *)local_3e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_368,vkd,device,
             *(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_230.m_device = local_358;
  DStack_230.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_238.m_internal = local_368._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)local_368._8_8_;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != &local_3d8) {
    operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
  }
  local_3d8._M_allocated_capacity = 0x676172662d697274;
  local_3e8._8_8_ = (DeviceInterface *)0x8;
  local_3d8._8_8_ = local_3d8._8_8_ & 0xffffffffffffff00;
  local_3e8._0_8_ = &local_3d8;
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)binaryRegistry,(key_type *)local_3e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_368,vkd,device,
             *(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_250.m_device = local_358;
  DStack_250.m_allocator = (VkAllocationCallbacks *)VStack_350.m_internal;
  local_258.m_internal = local_368._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)local_368._8_8_;
  local_368._0_8_ = 0;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x0;
  VStack_350.m_internal = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._0_8_ != &local_3d8) {
    operator_delete((void *)local_3e8._0_8_,(ulong)(local_3d8._M_allocated_capacity + 1));
  }
  p_Stack_290 = (PFN_vkInternalFreeNotification)&local_b8;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_2b8._0_4_ = 0x12;
  local_2b8._8_8_ = (PFN_vkAllocationFunction)0x0;
  local_2b8._16_8_ = (PFN_vkReallocationFunction)0x100000000;
  p_Stack_2a0 = (PFN_vkFreeFunction)local_238.m_internal;
  local_298 = (PFN_vkInternalAllocationNotification)0xac0965;
  local_288 = CONCAT44(local_288._4_4_,0x12);
  local_280 = 0;
  local_278 = 0x1000000000;
  local_270 = local_258.m_internal;
  local_268 = "main";
  local_3e8._8_8_ = (DeviceInterface *)0x0;
  local_3d8._M_allocated_capacity = 0;
  pVStack_3b0 = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  uStack_390 = 0;
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3c8._0_4_ = 0;
  local_3c8._4_4_ = 0;
  pVStack_3c0 = (VkSubpassDescription *)0x0;
  local_3e8._0_8_ = (Allocation *)0x19;
  local_3d8._8_8_ = (VkAllocationCallbacks *)0x700000000;
  local_3b8._0_4_ = 0;
  local_3b8._4_4_ = 7;
  local_398 = 7;
  local_388 = 0x3f800000bf800000;
  local_210.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)&local_110;
  local_110.x = 0.0;
  local_110.y = 0.0;
  local_120.format = renderSize->m_data[0];
  local_110.width = (float)local_120.format;
  local_120.offset = renderSize->m_data[1];
  local_110.height = (float)local_120.offset;
  local_210.pVertexAttributeDescriptions = &local_120;
  local_120.location = 0;
  local_120.binding = 0;
  local_110.minDepth = 0.0;
  local_110.maxDepth = 1.0;
  local_210.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_210.pNext = (void *)0x0;
  local_210.flags = 0;
  local_210.vertexBindingDescriptionCount = 1;
  local_210.vertexAttributeDescriptionCount = 1;
  local_60.pVertexBindingDescriptions = &local_148;
  local_148.binding = 0;
  local_148.stride = 0x10;
  local_348 = &local_60;
  local_60.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_60.pNext = (void *)0x0;
  local_60.flags = 0;
  local_60.vertexBindingDescriptionCount = 1;
  local_148.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_320 = &local_98;
  local_98.pNext = (void *)0x0;
  local_98.sampleShadingEnable = 0;
  local_98.minSampleShading = 0.0;
  local_98.pSampleMask = (VkSampleMask *)0x0;
  local_98.alphaToCoverageEnable = 0;
  local_98.alphaToOneEnable = 0;
  local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_98._4_4_ = 0;
  local_98.flags = 0;
  local_98.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_60.vertexAttributeDescriptionCount = 1;
  local_60.pVertexAttributeDescriptions = &local_138;
  local_138.location = 0;
  local_138.binding = 0;
  local_138.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_138.offset = 0;
  local_1e0._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_1e0._8_8_ = (DeviceInterface *)0x0;
  local_1d0 = (VkDevice)0x0;
  pVStack_1c8 = (VkAllocationCallbacks *)0x100000003;
  local_1c0 = &local_f8;
  local_f8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_f8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_f8.alphaBlendOp = VK_BLEND_OP_ADD;
  local_f8.colorWriteMask = 0xf;
  local_f8.blendEnable = 0;
  local_f8.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_f8.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_f8.colorBlendOp = VK_BLEND_OP_ADD;
  local_368._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)0x200000000;
  pVStack_340 = &local_d8;
  local_d8.flags = 0;
  local_d8.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_d8.primitiveRestartEnable = 0;
  local_d8._28_4_ = 0;
  local_d8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_d8._4_4_ = 0;
  local_d8.pNext = (void *)0x0;
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  pVStack_330 = &local_210;
  local_310 = (VkPipelineColorBlendStateCreateInfo *)local_1e0;
  local_308 = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_2f0 = 0;
  local_2e8.m_internal = 0;
  local_2e0 = 0;
  p_Stack_1a0 = (PFN_vkAllocationFunction)0x0;
  local_178 = 0;
  local_188 = (PFN_vkInternalAllocationNotification)0x0;
  p_Stack_180 = (PFN_vkInternalFreeNotification)0x0;
  p_Stack_198 = (PFN_vkReallocationFunction)0x0;
  p_Stack_190 = (PFN_vkFreeFunction)0x0;
  local_1a8 = (void *)0x17;
  uStack_170 = 0x3f800000;
  local_1b8[0] = 0.0;
  local_1b8[1] = 0.0;
  local_1b8[2] = 0.0;
  local_1b8[3] = 0.0;
  VStack_350.m_internal = (deUint64)local_2b8;
  local_328 = (VkPipelineRasterizationStateCreateInfo *)&local_1a8;
  local_318 = (VkPipelineDepthStencilStateCreateInfo *)local_3e8;
  local_300.m_internal = dVar2;
  local_2f8.m_internal = dVar1;
  local_260 = p_Stack_290;
  ::vk::createGraphicsPipeline
            (&local_168,vkd,device,(VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)local_368,
             (VkAllocationCallbacks *)0x0);
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_250,local_258);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_230,local_238);
  }
  local_2d0 = &this->m_pipeline;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  (local_2d0->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  (this->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_368._4_4_ =
       (undefined4)
       (local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal >> 0x20);
  local_368._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_368._8_8_ = (DeviceInterface *)0x0;
  local_358 = (VkDevice)
              ((ulong)local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                      m_device & 0xffffffff00000000);
  VStack_350.m_internal = (deUint64)&DAT_00000030;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)0x80;
  pVStack_340 = (VkPipelineInputAssemblyStateCreateInfo *)((ulong)pVStack_340 & 0xffffffff00000000);
  local_338 = (VkPipelineTessellationStateCreateInfo *)0x0;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3e8,vkd,device,
                     (VkBufferCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
  local_2d8 = &this->m_vertexBuffer;
  local_358 = (VkDevice)local_3d8._M_allocated_capacity;
  VStack_350.m_internal = local_3d8._8_8_;
  local_368._0_8_ = local_3e8._0_8_;
  local_368._8_8_ = local_3e8._8_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)local_3d8._M_allocated_capacity;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)local_3d8._8_8_;
  (local_2d8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
       local_3e8._0_8_;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_3e8._8_8_;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_368,vkd,device,
             (VkBuffer)
             (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal);
  (*allocator->_vptr_Allocator[3])(local_3e8,allocator,local_368,1);
  pvVar8 = local_370;
  (this->m_vertexBufferMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)local_3e8._0_8_;
  this_00 = &this->m_attachmentViews;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_framebuffers).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_attachmentViews).
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
  ::resize(this_00,(long)(local_370->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_370->
                         super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                         )._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
  ::resize(&this->m_framebuffers,
           (long)(pvVar8->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar8->
                 super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3);
  pHVar16 = (pvVar8->
            super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar8->
      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pHVar16) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      pdVar11 = (deUint64 *)operator_new(0x20);
      VStack_350.m_internal = pHVar16[uVar15].m_internal;
      local_368._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      local_368._8_8_ = (DeviceInterface *)0x0;
      local_358 = (VkDevice)((ulong)local_358 & 0xffffffff00000000);
      local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(framebufferFormat,1);
      pVStack_340 = (VkPipelineInputAssemblyStateCreateInfo *)0x400000003;
      local_338 = (VkPipelineTessellationStateCreateInfo *)0x600000005;
      pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)&DAT_00000001;
      local_328 = (VkPipelineRasterizationStateCreateInfo *)&DAT_00000001;
      local_320 = (VkPipelineMultisampleStateCreateInfo *)CONCAT44(local_320._4_4_,1);
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)local_3e8,vkd,device,
                 (VkImageViewCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
      pdVar11[2] = local_3d8._M_allocated_capacity;
      pdVar11[3] = local_3d8._8_8_;
      *pdVar11 = local_3e8._0_8_;
      pdVar11[1] = local_3e8._8_8_;
      local_3e8._0_8_ = (pointer)0x0;
      local_3e8._8_8_ = (DeviceInterface *)0x0;
      local_3d8._M_allocated_capacity = 0;
      local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00cef1b0;
      plVar12[2] = (long)pdVar11;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      pSVar3 = (this_00->
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      plVar4 = *(long **)((long)&pSVar3->m_state + lVar14);
      if (plVar4 != plVar12) {
        if (plVar4 != (long *)0x0) {
          LOCK();
          plVar4 = plVar4 + 1;
          *(int *)plVar4 = (int)*plVar4 + -1;
          UNLOCK();
          if ((int)*plVar4 == 0) {
            *(undefined8 *)((long)&pSVar3->m_ptr + lVar14) = 0;
            (**(code **)(**(long **)((long)&pSVar3->m_state + lVar14) + 0x10))();
          }
          LOCK();
          piVar13 = (int *)(*(long *)((long)&pSVar3->m_state + lVar14) + 0xc);
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            plVar4 = *(long **)((long)&pSVar3->m_state + lVar14);
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
            *(undefined8 *)((long)&pSVar3->m_state + lVar14) = 0;
          }
        }
        *(deUint64 **)((long)&pSVar3->m_ptr + lVar14) = pdVar11;
        *(long **)((long)&pSVar3->m_state + lVar14) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar13 = (int *)(*(long *)((long)&pSVar3->m_state + lVar14) + 0xc);
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      plVar4 = plVar12 + 1;
      LOCK();
      *(int *)plVar4 = (int)*plVar4 + -1;
      UNLOCK();
      if ((int)*plVar4 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      piVar13 = (int *)((long)plVar12 + 0xc);
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_3e8 + 8),
                   (VkImageView)local_3e8._0_8_);
      }
      pdVar11 = (deUint64 *)operator_new(0x20);
      VStack_350.m_internal =
           (local_378->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
      local_2b8._0_8_ =
           **(undefined8 **)
             ((long)&((this_00->
                      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar14);
      local_368._0_4_ = 0x25;
      local_368._8_8_ = (DeviceInterface *)0x0;
      local_358 = (VkDevice)((ulong)local_358 & 0xffffffff00000000);
      local_348 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(local_348._4_4_,1);
      pVStack_340 = (VkPipelineInputAssemblyStateCreateInfo *)local_2b8;
      local_338 = *(VkPipelineTessellationStateCreateInfo **)renderSize->m_data;
      pVStack_330 = (VkPipelineVertexInputStateCreateInfo *)CONCAT44(pVStack_330._4_4_,1);
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)local_3e8,vkd,device,
                 (VkFramebufferCreateInfo *)local_368,(VkAllocationCallbacks *)0x0);
      pdVar11[2] = local_3d8._M_allocated_capacity;
      pdVar11[3] = local_3d8._8_8_;
      *pdVar11 = local_3e8._0_8_;
      pdVar11[1] = local_3e8._8_8_;
      local_3e8._0_8_ = (pointer)0x0;
      local_3e8._8_8_ = (DeviceInterface *)0x0;
      local_3d8._M_allocated_capacity = 0;
      local_3d8._8_8_ = (VkAllocationCallbacks *)0x0;
      plVar12 = (long *)operator_new(0x20);
      *(undefined4 *)(plVar12 + 1) = 0;
      *(undefined4 *)((long)plVar12 + 0xc) = 0;
      *plVar12 = (long)&PTR__SharedPtrState_00cef530;
      plVar12[2] = (long)pdVar11;
      *(undefined4 *)(plVar12 + 1) = 1;
      *(undefined4 *)((long)plVar12 + 0xc) = 1;
      pSVar5 = (this->m_framebuffers).
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar4 = *(long **)((long)&pSVar5->m_state + lVar14);
      if (plVar4 != plVar12) {
        if (plVar4 != (long *)0x0) {
          LOCK();
          plVar4 = plVar4 + 1;
          *(int *)plVar4 = (int)*plVar4 + -1;
          UNLOCK();
          if ((int)*plVar4 == 0) {
            *(undefined8 *)((long)&pSVar5->m_ptr + lVar14) = 0;
            (**(code **)(**(long **)((long)&pSVar5->m_state + lVar14) + 0x10))();
          }
          LOCK();
          piVar13 = (int *)(*(long *)((long)&pSVar5->m_state + lVar14) + 0xc);
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            plVar4 = *(long **)((long)&pSVar5->m_state + lVar14);
            if (plVar4 != (long *)0x0) {
              (**(code **)(*plVar4 + 8))();
            }
            *(undefined8 *)((long)&pSVar5->m_state + lVar14) = 0;
          }
        }
        *(deUint64 **)((long)&pSVar5->m_ptr + lVar14) = pdVar11;
        *(long **)((long)&pSVar5->m_state + lVar14) = plVar12;
        LOCK();
        *(int *)(plVar12 + 1) = (int)plVar12[1] + 1;
        UNLOCK();
        LOCK();
        piVar13 = (int *)(*(long *)((long)&pSVar5->m_state + lVar14) + 0xc);
        *piVar13 = *piVar13 + 1;
        UNLOCK();
      }
      plVar4 = plVar12 + 1;
      LOCK();
      *(int *)plVar4 = (int)*plVar4 + -1;
      UNLOCK();
      if ((int)*plVar4 == 0) {
        (**(code **)(*plVar12 + 0x10))(plVar12);
      }
      piVar13 = (int *)((long)plVar12 + 0xc);
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        (**(code **)(*plVar12 + 8))(plVar12);
      }
      if ((pointer)local_3e8._0_8_ != (pointer)0x0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_3e8 + 8),
                   (VkFramebuffer)local_3e8._0_8_);
      }
      uVar15 = uVar15 + 1;
      pHVar16 = (local_370->
                super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (uVar15 < (ulong)((long)(local_370->
                                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar16 >> 3
                             ));
  }
  pAVar6 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  VVar9 = (*vkd->_vptr_DeviceInterface[0xc])
                    (vkd,device,
                     (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                     object.m_internal,(pAVar6->m_memory).m_internal,pAVar6->m_offset);
  ::vk::checkResult(VVar9,
                    "vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x49f);
  local_368._0_4_ = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
  local_368._8_8_ = (DeviceInterface *)0x0;
  pAVar6 = (this->m_vertexBufferMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  local_358 = (VkDevice)(pAVar6->m_memory).m_internal;
  VStack_350.m_internal = pAVar6->m_offset;
  local_348 = (VkPipelineVertexInputStateCreateInfo *)0xffffffffffffffff;
  puVar7 = (undefined8 *)pAVar6->m_hostPtr;
  *puVar7 = 0xbf000000bf000000;
  puVar7[1] = 0x3f80000000000000;
  puVar7[2] = 0xbf0000003f000000;
  puVar7[3] = 0x3f80000000000000;
  *(undefined4 *)(puVar7 + 4) = 0;
  *(undefined4 *)((long)puVar7 + 0x24) = 0x3f000000;
  *(undefined4 *)(puVar7 + 5) = 0;
  *(undefined4 *)((long)puVar7 + 0x2c) = 0x3f800000;
  VVar9 = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1);
  ::vk::checkResult(VVar9,"vkd.flushMappedMemoryRanges(device, 1u, &memRange)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                    ,0x4b3);
  return;
}

Assistant:

TriangleRenderer::TriangleRenderer (const DeviceInterface&	vkd,
									const VkDevice			device,
									Allocator&				allocator,
									const BinaryCollection&	binaryRegistry,
									const vector<VkImage>	swapchainImages,
									const VkFormat			framebufferFormat,
									const UVec2&			renderSize)
	: m_vkd					(vkd)
	, m_swapchainImages		(swapchainImages)
	, m_renderSize			(renderSize)
	, m_renderPass			(createRenderPass(vkd, device, framebufferFormat))
	, m_pipelineLayout		(createPipelineLayout(vkd, device))
	, m_pipeline			(createPipeline(vkd, device, *m_renderPass, *m_pipelineLayout, binaryRegistry, renderSize))
	, m_vertexBuffer		(createBuffer(vkd, device, (VkDeviceSize)(sizeof(float)*4*3), VK_BUFFER_USAGE_VERTEX_BUFFER_BIT))
	, m_vertexBufferMemory	(allocator.allocate(getBufferMemoryRequirements(vkd, device, *m_vertexBuffer),
							 MemoryRequirement::HostVisible))
{
	m_attachmentViews.resize(swapchainImages.size());
	m_framebuffers.resize(swapchainImages.size());

	for (size_t imageNdx = 0; imageNdx < swapchainImages.size(); ++imageNdx)
	{
		m_attachmentViews[imageNdx]	= ImageViewSp(new Unique<VkImageView>(createAttachmentView(vkd, device, swapchainImages[imageNdx], framebufferFormat)));
		m_framebuffers[imageNdx]	= FramebufferSp(new Unique<VkFramebuffer>(createFramebuffer(vkd, device, *m_renderPass, **m_attachmentViews[imageNdx], renderSize)));
	}

	VK_CHECK(vkd.bindBufferMemory(device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset()));

	{
		const VkMappedMemoryRange	memRange	=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,
			m_vertexBufferMemory->getMemory(),
			m_vertexBufferMemory->getOffset(),
			VK_WHOLE_SIZE
		};
		const tcu::Vec4				vertices[]	=
		{
			tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
			tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
		};
		DE_STATIC_ASSERT(sizeof(vertices) == sizeof(float)*4*3);

		deMemcpy(m_vertexBufferMemory->getHostPtr(), &vertices[0], sizeof(vertices));
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1u, &memRange));
	}
}